

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::SeriesMatcher::smokeTest(SeriesMatcher *this,StringSegment *segment)

{
  long *plVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NumberParseMatcher **matcher;
  NumberParseMatcher **__end1;
  NumberParseMatcher **__begin1;
  SeriesMatcher *__range1;
  StringSegment *segment_local;
  SeriesMatcher *this_local;
  
  iVar3 = (*(this->super_CompositionMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher[7])()
  ;
  iVar4 = (*(this->super_CompositionMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher[8])()
  ;
  if ((undefined8 *)CONCAT44(extraout_var,iVar3) == (undefined8 *)CONCAT44(extraout_var_00,iVar4)) {
    this_local._7_1_ = false;
  }
  else {
    plVar1 = *(long **)CONCAT44(extraout_var,iVar3);
    bVar2 = (**(code **)(*plVar1 + 0x20))(plVar1,segment);
    this_local._7_1_ = (bool)(bVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool SeriesMatcher::smokeTest(const StringSegment& segment) const {
    // NOTE: The range-based for loop calls the virtual begin() and end() methods.
    // NOTE: We only want the first element. Use the for loop for boundary checking.
    for (auto& matcher : *this) {
        // SeriesMatchers are never allowed to start with a Flexible matcher.
        U_ASSERT(!matcher->isFlexible());
        return matcher->smokeTest(segment);
    }
    return false;
}